

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::TestsupportsSubMillisecondTimestamps::TestsupportsSubMillisecondTimestamps
          (TestsupportsSubMillisecondTimestamps *this)

{
  char *suiteName;
  TestsupportsSubMillisecondTimestamps *this_local;
  
  suiteName = SuiteSessionTests::UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"supportsSubMillisecondTimestamps",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/SessionTestCase.cpp"
             ,0x25d);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TestsupportsSubMillisecondTimestamps_00459db0;
  return;
}

Assistant:

TEST(supportsSubMillisecondTimestamps)
{
  CHECK( !Session::supportsSubSecondTimestamps(FIX::BeginString_FIX40) );
  CHECK( !Session::supportsSubSecondTimestamps(FIX::BeginString_FIX41) );
  CHECK( Session::supportsSubSecondTimestamps(FIX::BeginString_FIX42) );
  CHECK( Session::supportsSubSecondTimestamps(FIX::BeginString_FIX43) );
  CHECK( Session::supportsSubSecondTimestamps(FIX::BeginString_FIX44) );
  CHECK( Session::supportsSubSecondTimestamps(FIX::BeginString_FIXT11) );
}